

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

void cf_h2_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  long *plVar1;
  HTTP *pHVar2;
  curl_socket_t cVar3;
  int32_t iVar4;
  int iVar5;
  int32_t *piVar6;
  bool bVar7;
  _Bool want_send;
  _Bool want_recv;
  _Bool local_3e;
  _Bool local_3d;
  curl_socket_t local_3c;
  undefined8 local_38;
  
  plVar1 = (long *)cf->ctx;
  if (*plVar1 == 0) {
    return;
  }
  cVar3 = Curl_conn_cf_get_socket(cf,data);
  Curl_pollset_check(data,ps,cVar3,&local_3d,&local_3e);
  if ((local_3d == false) && (local_3e != true)) {
    return;
  }
  if ((data == (Curl_easy *)0x0) || (pHVar2 = (data->req).p.http, pHVar2 == (HTTP *)0x0)) {
    piVar6 = (int32_t *)0x0;
  }
  else {
    piVar6 = (int32_t *)pHVar2->h2_ctx;
  }
  local_38 = *(undefined8 *)((long)cf->ctx + 0x10);
  *(Curl_easy **)((long)cf->ctx + 0x10) = data;
  local_3c = cVar3;
  if (local_3e == true) {
    iVar4 = nghttp2_session_get_remote_window_size((nghttp2_session *)*plVar1);
    bVar7 = iVar4 == 0;
  }
  else {
    bVar7 = false;
  }
  if (((local_3e == true) && (piVar6 != (int32_t *)0x0)) && (-1 < *piVar6)) {
    iVar4 = nghttp2_session_get_stream_remote_window_size((nghttp2_session *)*plVar1,*piVar6);
    local_3d = (_Bool)(iVar4 == 0 | bVar7 | local_3d & 1U);
    if (iVar4 != 0) goto LAB_006aa7de;
    if (bVar7 != false) {
      local_3e = false;
      cVar3 = local_3c;
      goto LAB_006aa7fd;
    }
  }
  else {
    local_3d = (_Bool)(local_3d & 1U | bVar7);
LAB_006aa7de:
    cVar3 = local_3c;
    if (bVar7 != false || (local_3e & 1U) != 0) goto LAB_006aa7fd;
  }
  cVar3 = local_3c;
  iVar5 = nghttp2_session_want_write((nghttp2_session *)*plVar1);
  local_3e = iVar5 != 0;
LAB_006aa7fd:
  Curl_pollset_set(data,ps,cVar3,local_3d,local_3e);
  *(undefined8 *)((long)cf->ctx + 0x10) = local_38;
  return;
}

Assistant:

static void cf_h2_adjust_pollset(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct easy_pollset *ps)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  curl_socket_t sock;
  bool want_recv, want_send;

  if(!ctx->h2)
    return;

  sock = Curl_conn_cf_get_socket(cf, data);
  Curl_pollset_check(data, ps, sock, &want_recv, &want_send);
  if(want_recv || want_send) {
    struct stream_ctx *stream = H2_STREAM_CTX(data);
    struct cf_call_data save;
    bool c_exhaust, s_exhaust;

    CF_DATA_SAVE(save, cf, data);
    c_exhaust = want_send && !nghttp2_session_get_remote_window_size(ctx->h2);
    s_exhaust = want_send && stream && stream->id >= 0 &&
                !nghttp2_session_get_stream_remote_window_size(ctx->h2,
                                                               stream->id);
    want_recv = (want_recv || c_exhaust || s_exhaust);
    want_send = (!s_exhaust && want_send) ||
                (!c_exhaust && nghttp2_session_want_write(ctx->h2));

    Curl_pollset_set(data, ps, sock, want_recv, want_send);
    CF_DATA_RESTORE(cf, save);
  }
}